

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFTextString.cpp
# Opt level: O3

string * __thiscall
PDFTextString::ToUTF8FromUTF16BE_abi_cxx11_(string *__return_storage_ptr__,PDFTextString *this)

{
  EStatusCodeAndString result;
  UnicodeString unicodeString;
  EStatusCodeAndString EStack_58;
  UnicodeString local_30;
  
  UnicodeString::UnicodeString(&local_30);
  UnicodeString::FromUTF16(&local_30,&this->mTextString);
  UnicodeString::ToUTF8_abi_cxx11_(&EStack_58,&local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,EStack_58.second._M_dataplus._M_p,
             EStack_58.second._M_dataplus._M_p + EStack_58.second._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)EStack_58.second._M_dataplus._M_p != &EStack_58.second.field_2) {
    operator_delete(EStack_58.second._M_dataplus._M_p,
                    EStack_58.second.field_2._M_allocated_capacity + 1);
  }
  UnicodeString::~UnicodeString(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string PDFTextString::ToUTF8FromUTF16BE() const
{
	UnicodeString unicodeString;

	unicodeString.FromUTF16(mTextString);

	EStatusCodeAndString result = unicodeString.ToUTF8();
	return result.second;
}